

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaReadAig.c
# Opt level: O2

Aig_Man_t * Ioa_ReadAigerFromMemory(char *pContents,int nFileSize,int fCheck)

{
  Vec_Int_t *__ptr;
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Aig_Man_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  Aig_Obj_t *pAVar8;
  void *pvVar9;
  void *pvVar10;
  char cVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  undefined4 uVar16;
  ulong uVar17;
  char *pcVar18;
  bool bVar19;
  size_t sStack_a0;
  char *local_98;
  Vec_Ptr_t *local_90;
  ulong local_88;
  char *local_80;
  Aig_Man_t *local_78;
  int local_6c;
  undefined8 local_68;
  int local_5c;
  Vec_Int_t *local_58;
  ulong local_50;
  int local_48;
  uint local_44;
  undefined4 local_40;
  int local_3c;
  char *local_38;
  
  if ((((*pContents == 'a') && (pContents[1] == 'i')) && (pContents[2] == 'g')) &&
     ((pcVar18 = pContents, pContents[3] == '2' || (pContents[3] == ' ')))) {
    do {
      cVar11 = *pcVar18;
      pcVar18 = pcVar18 + 1;
    } while (cVar11 != ' ');
    local_98 = pcVar18;
    local_3c = nFileSize;
    iVar1 = atoi(pcVar18);
    do {
      cVar11 = *pcVar18;
      pcVar18 = pcVar18 + 1;
    } while (cVar11 != ' ');
    local_98 = pcVar18;
    uVar2 = atoi(pcVar18);
    pVVar7 = (Vec_Ptr_t *)(ulong)uVar2;
    do {
      cVar11 = *pcVar18;
      pcVar18 = pcVar18 + 1;
    } while (cVar11 != ' ');
    local_98 = pcVar18;
    local_6c = atoi(pcVar18);
    local_68 = CONCAT44(extraout_var,local_6c);
    do {
      cVar11 = *pcVar18;
      pcVar18 = pcVar18 + 1;
    } while (cVar11 != ' ');
    local_98 = pcVar18;
    uVar2 = atoi(pcVar18);
    do {
      cVar11 = *pcVar18;
      pcVar18 = pcVar18 + 1;
    } while (cVar11 != ' ');
    local_98 = pcVar18;
    iVar3 = atoi(pcVar18);
    local_80 = (char *)CONCAT44(extraout_var_00,iVar3);
    local_78 = (Aig_Man_t *)CONCAT44(local_78._4_4_,iVar1);
LAB_005e54db:
    if (*pcVar18 == '\n') {
      uVar16 = 0;
    }
    else {
      if (*pcVar18 != ' ') goto code_r0x005e54e9;
      if (uVar2 != 0) {
        __assert_fail("nOutputs == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ioa/ioaReadAig.c"
                      ,0x89,"Aig_Man_t *Ioa_ReadAigerFromMemory(char *, int, int)");
      }
      pcVar18 = pcVar18 + 1;
      local_98 = pcVar18;
      uVar2 = atoi(pcVar18);
      for (; (*pcVar18 != '\n' && (*pcVar18 != ' ')); pcVar18 = pcVar18 + 1) {
      }
      uVar16 = CONCAT31((int3)((uint)iVar1 >> 8),uVar2 != 0);
    }
    cVar11 = *pcVar18;
    bVar19 = false;
    if (cVar11 == ' ') {
      pcVar18 = pcVar18 + 1;
      local_98 = pcVar18;
      uVar4 = atoi(pcVar18);
      for (; (*pcVar18 != '\n' && (*pcVar18 != ' ')); pcVar18 = pcVar18 + 1) {
      }
      local_88 = (ulong)(uVar4 + uVar2);
      cVar11 = *pcVar18;
      if (cVar11 == ' ') {
        pcVar18 = pcVar18 + 1;
        local_98 = pcVar18;
        local_90 = pVVar7;
        iVar1 = atoi(pcVar18);
        for (; (*pcVar18 != '\n' && (*pcVar18 != ' ')); pcVar18 = pcVar18 + 1) {
        }
        local_88 = (ulong)(uint)((int)local_88 + iVar1);
        bVar19 = iVar1 != 0;
        cVar11 = *pcVar18;
        pVVar7 = local_90;
        local_98 = pcVar18;
        if (cVar11 == ' ') {
          pcVar18 = pcVar18 + 1;
          local_98 = pcVar18;
          iVar3 = atoi(pcVar18);
          for (; (*pcVar18 != '\n' && (*pcVar18 != ' ')); pcVar18 = pcVar18 + 1) {
          }
          local_88 = (ulong)(uint)((int)local_88 + iVar3);
          cVar11 = *pcVar18;
          bVar19 = iVar1 != 0 || iVar3 != 0;
          pVVar7 = local_90;
          local_98 = pcVar18;
        }
      }
      else {
        bVar19 = false;
        local_98 = pcVar18;
      }
    }
    else {
      uVar4 = 0;
      local_88 = (ulong)uVar2;
      local_98 = pcVar18;
    }
    if (cVar11 == '\n') {
      pcVar18 = local_98 + 1;
      uVar2 = (int)local_68 + (int)pVVar7;
      local_50 = (ulong)uVar2;
      local_98 = pcVar18;
      local_40 = uVar16;
      if ((int)local_78 == (int)local_80 + uVar2) {
        if (!bVar19) {
          local_90 = pVVar7;
          if (uVar4 != 0) {
            if (uVar4 == 1) {
              fwrite("Warning: The last output is interpreted as a constraint.\n",0x39,1,_stdout);
            }
            else {
              fprintf(_stdout,"Warning: The last %d outputs are interpreted as constraints.\n",
                      (ulong)uVar4);
            }
          }
          iVar3 = (int)local_80;
          pAVar6 = Aig_ManStart(iVar3);
          uVar12 = local_50;
          pAVar6->nConstrs = uVar4;
          iVar1 = (int)local_50;
          local_44 = uVar4;
          pVVar7 = Vec_PtrAlloc(iVar3 + iVar1 + 1);
          local_78 = pAVar6;
          Vec_PtrPush(pVVar7,(void *)((ulong)pAVar6->pConst1 ^ 1));
          uVar17 = 0;
          if (0 < iVar1) {
            uVar17 = uVar12 & 0xffffffff;
          }
          while (iVar3 = (int)uVar17, uVar17 = (ulong)(iVar3 - 1), iVar3 != 0) {
            pAVar8 = Aig_ObjCreateCi(local_78);
            Vec_PtrPush(pVVar7,pAVar8);
          }
          local_78->nRegs = local_6c;
          local_48 = (int)local_88 + (int)local_68;
          local_5c = fCheck;
          local_38 = pContents;
          if (pContents[3] == ' ') {
            iVar3 = (int)local_90;
            local_98 = pcVar18;
            for (iVar5 = 0; iVar5 < local_48; iVar5 = iVar5 + (uint)(cVar11 == '\n')) {
              cVar11 = *local_98;
              local_98 = local_98 + 1;
            }
            local_58 = (Vec_Int_t *)0x0;
          }
          else {
            local_58 = Ioa_WriteDecodeLiterals(&local_98,local_48);
            iVar3 = (int)local_90;
          }
          uVar12 = 0;
          if (0 < (int)local_80) {
            uVar12 = (ulong)local_80 & 0xffffffff;
          }
          iVar1 = iVar1 * 2;
          iVar3 = (int)local_68 + iVar3;
          local_90 = pVVar7;
          while( true ) {
            iVar1 = iVar1 + 2;
            if ((int)uVar12 == 0) break;
            local_50 = CONCAT44(local_50._4_4_,(int)uVar12 + -1);
            local_80 = (char *)CONCAT44(local_80._4_4_,iVar3 + 1);
            uVar2 = Ioa_ReadAigerDecode(&local_98);
            uVar4 = Ioa_ReadAigerDecode(&local_98);
            pVVar7 = local_90;
            uVar4 = iVar1 - (uVar4 + uVar2);
            pvVar9 = Vec_PtrEntry(local_90,uVar4 >> 1);
            pvVar10 = Vec_PtrEntry(pVVar7,iVar1 - uVar2 >> 1);
            if ((int)local_80 != pVVar7->nSize) {
              __assert_fail("Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ioa/ioaReadAig.c"
                            ,0x100,"Aig_Man_t *Ioa_ReadAigerFromMemory(char *, int, int)");
            }
            pAVar8 = Aig_And(local_78,(Aig_Obj_t *)((ulong)(uVar4 & 1) ^ (ulong)pvVar9),
                             (Aig_Obj_t *)((ulong)pvVar10 ^ (ulong)(iVar1 - uVar2 & 1)));
            Vec_PtrPush(pVVar7,pAVar8);
            uVar12 = local_50 & 0xffffffff;
            iVar3 = (int)local_80;
          }
          local_80 = local_98;
          pVVar7 = Vec_PtrAlloc(local_48);
          iVar1 = local_5c;
          uVar12 = local_88;
          iVar3 = (int)local_68;
          iVar5 = (int)local_88;
          if (local_38[3] == ' ') {
            iVar13 = 0;
            local_98 = pcVar18;
            iVar14 = 0;
            if (0 < iVar3) {
              iVar14 = iVar3;
            }
            for (; iVar1 = local_5c, iVar13 != iVar14; iVar13 = iVar13 + 1) {
              uVar2 = atoi(pcVar18);
              do {
                cVar11 = *pcVar18;
                pcVar18 = pcVar18 + 1;
              } while (cVar11 != '\n');
              pvVar9 = Vec_PtrEntry(local_90,uVar2 >> 1);
              Vec_PtrPush(pVVar7,(void *)((ulong)(uVar2 & 1) ^ (ulong)pvVar9));
            }
            iVar14 = 0;
            uVar17 = uVar12 & 0xffffffff;
            local_98 = pcVar18;
            if (iVar5 < 1) {
              uVar17 = 0;
            }
            for (; iVar3 = local_6c, iVar14 != (int)uVar17; iVar14 = iVar14 + 1) {
              uVar2 = atoi(pcVar18);
              do {
                cVar11 = *pcVar18;
                pcVar18 = pcVar18 + 1;
              } while (cVar11 != '\n');
              pvVar9 = Vec_PtrEntry(local_90,uVar2 >> 1);
              Vec_PtrPush(pVVar7,(void *)((ulong)(uVar2 & 1) ^ (ulong)pvVar9));
            }
          }
          else {
            iVar13 = 0;
            iVar14 = 0;
            if (0 < iVar3) {
              iVar14 = iVar3;
            }
            for (; iVar14 != iVar13; iVar13 = iVar13 + 1) {
              uVar2 = Vec_IntEntry(local_58,iVar13);
              pvVar9 = Vec_PtrEntry(local_90,uVar2 >> 1);
              Vec_PtrPush(pVVar7,(void *)((ulong)(uVar2 & 1) ^ (ulong)pvVar9));
            }
            uVar15 = 0;
            iVar3 = local_6c;
            uVar17 = uVar15;
            if (0 < iVar5) {
              uVar15 = uVar12 & 0xffffffff;
              uVar17 = uVar15;
            }
            while (__ptr = local_58, iVar5 = (int)uVar15, uVar15 = (ulong)(iVar5 - 1), iVar5 != 0) {
              uVar2 = Vec_IntEntry(local_58,iVar3);
              pvVar9 = Vec_PtrEntry(local_90,uVar2 >> 1);
              Vec_PtrPush(pVVar7,(void *)((ulong)(uVar2 & 1) ^ (ulong)pvVar9));
              iVar3 = iVar3 + 1;
            }
            free(local_58->pArray);
            free(__ptr);
            iVar3 = local_6c;
          }
          while (pcVar18 = local_38, pAVar6 = local_78, iVar5 = (int)uVar17,
                uVar17 = (ulong)(iVar5 - 1), iVar5 != 0) {
            pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pVVar7,iVar3);
            Aig_ObjCreateCo(local_78,pAVar8);
            iVar3 = iVar3 + 1;
          }
          iVar5 = 0;
          iVar3 = (int)local_68;
          if ((int)local_68 < 1) {
            iVar3 = 0;
          }
          for (; iVar3 != iVar5; iVar5 = iVar5 + 1) {
            pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(pVVar7,iVar5);
            Aig_ObjCreateCo(pAVar6,pAVar8);
          }
          Vec_PtrFree(pVVar7);
          uVar16 = local_40;
          if (((local_80 + 1 < pcVar18 + local_3c) && (*local_80 == 'c')) && (local_80[1] == 'n')) {
            pcVar18 = local_80 + 2;
            if (pAVar6->pName != (char *)0x0) {
              free(pAVar6->pName);
              pAVar6->pName = (char *)0x0;
            }
            pcVar18 = Abc_UtilStrsav(pcVar18);
            pAVar6->pName = pcVar18;
          }
          bVar19 = local_44 == 0;
          Vec_PtrFree(local_90);
          Aig_ManCleanup(pAVar6);
          Aig_ManSetRegNum(pAVar6,pAVar6->nRegs);
          if ((~(byte)uVar16 & bVar19) == 0) {
            Aig_ManInvertConstraints(pAVar6);
          }
          if (iVar1 != 0) {
            iVar1 = Aig_ManCheck(pAVar6);
            if (iVar1 == 0) {
              puts("Ioa_ReadAiger: The network check has failed.");
              Aig_ManStop(pAVar6);
              return (Aig_Man_t *)0x0;
            }
            return pAVar6;
          }
          return pAVar6;
        }
        pcVar18 = "Reading AIGER files with liveness properties are currently not supported.\n";
        sStack_a0 = 0x4a;
      }
      else {
        pcVar18 = "The number of objects does not match.\n";
        sStack_a0 = 0x26;
      }
    }
    else {
      pcVar18 = "The parameter line is in a wrong format.\n";
      sStack_a0 = 0x29;
    }
  }
  else {
    pcVar18 = "Wrong input file format.\n";
    sStack_a0 = 0x19;
  }
  fwrite(pcVar18,sStack_a0,1,_stdout);
  return (Aig_Man_t *)0x0;
code_r0x005e54e9:
  pcVar18 = pcVar18 + 1;
  goto LAB_005e54db;
}

Assistant:

Aig_Man_t * Ioa_ReadAigerFromMemory( char * pContents, int nFileSize, int fCheck )
{
    Vec_Int_t * vLits = NULL;
    Vec_Ptr_t * vNodes, * vDrivers;//, * vTerms;
    Aig_Obj_t * pObj, * pNode0, * pNode1;
    Aig_Man_t * pNew;
    int nTotal, nInputs, nOutputs, nLatches, nAnds, i;//, iTerm, nDigits;
    int nBad = 0, nConstr = 0, nJust = 0, nFair = 0;
    char * pDrivers, * pSymbols, * pCur;//, * pType;
    unsigned uLit0, uLit1, uLit;

    // check if the input file format is correct
    if ( strncmp(pContents, "aig", 3) != 0 || (pContents[3] != ' ' && pContents[3] != '2') )
    {
        fprintf( stdout, "Wrong input file format.\n" );
        return NULL;
    }

    // read the parameters (M I L O A + B C J F)
    pCur = pContents;         while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of objects
    nTotal = atoi( pCur );    while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of inputs
    nInputs = atoi( pCur );   while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of latches
    nLatches = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of outputs
    nOutputs = atoi( pCur );  while ( *pCur != ' ' ) pCur++; pCur++;
    // read the number of nodes
    nAnds = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
    if ( *pCur == ' ' )
    {
        assert( nOutputs == 0 );
        // read the number of properties
        pCur++;
        nBad = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nBad;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nConstr = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nConstr;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nJust = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nJust;
    }
    if ( *pCur == ' ' )
    {
        // read the number of properties
        pCur++;
        nFair = atoi( pCur );     while ( *pCur != ' ' && *pCur != '\n' ) pCur++; 
        nOutputs += nFair;
    }
    if ( *pCur != '\n' )
    {
        fprintf( stdout, "The parameter line is in a wrong format.\n" );
        return NULL;
    }
    pCur++;

    // check the parameters
    if ( nTotal != nInputs + nLatches + nAnds )
    {
        fprintf( stdout, "The number of objects does not match.\n" );
        return NULL;
    }
    if ( nJust || nFair )
    {
        fprintf( stdout, "Reading AIGER files with liveness properties are currently not supported.\n" );
        return NULL;
    }

    if ( nConstr )
    {
        if ( nConstr == 1 )
            fprintf( stdout, "Warning: The last output is interpreted as a constraint.\n" );
        else
            fprintf( stdout, "Warning: The last %d outputs are interpreted as constraints.\n", nConstr );
    }

    // allocate the empty AIG
    pNew = Aig_ManStart( nAnds );
    pNew->nConstrs = nConstr;

    // prepare the array of nodes
    vNodes = Vec_PtrAlloc( 1 + nInputs + nLatches + nAnds );
    Vec_PtrPush( vNodes, Aig_ManConst0(pNew) );

    // create the PIs
    for ( i = 0; i < nInputs + nLatches; i++ )
    {
        pObj = Aig_ObjCreateCi(pNew);    
        Vec_PtrPush( vNodes, pObj );
    }
/*
    // create the POs
    for ( i = 0; i < nOutputs + nLatches; i++ )
    {
        pObj = Aig_ObjCreateCo(pNew);   
    }
*/
    // create the latches
    pNew->nRegs = nLatches;
/*
    nDigits = Ioa_Base10Log( nLatches );
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Aig_ObjCreateLatch(pNew);
        Aig_LatchSetInit0( pObj );
        pNode0 = Aig_ObjCreateBi(pNew);
        pNode1 = Aig_ObjCreateBo(pNew);
        Aig_ObjAddFanin( pObj, pNode0 );
        Aig_ObjAddFanin( pNode1, pObj );
        Vec_PtrPush( vNodes, pNode1 );
        // assign names to latch and its input
//        Aig_ObjAssignName( pObj, Aig_ObjNameDummy("_L", i, nDigits), NULL );
//        printf( "Creating latch %s with input %d and output %d.\n", Aig_ObjName(pObj), pNode0->Id, pNode1->Id );
    } 
*/ 

    // remember the beginning of latch/PO literals
    pDrivers = pCur;
    if ( pContents[3] == ' ' ) // standard AIGER
    {
        // scroll to the beginning of the binary data
        for ( i = 0; i < nLatches + nOutputs; )
            if ( *pCur++ == '\n' )
                i++;
    }
    else // modified AIGER
    {
        vLits = Ioa_WriteDecodeLiterals( &pCur, nLatches + nOutputs );
    }

    // create the AND gates
//    pProgress = Bar_ProgressStart( stdout, nAnds );
    for ( i = 0; i < nAnds; i++ )
    {
//        Bar_ProgressUpdate( pProgress, i, NULL );
        uLit = ((i + 1 + nInputs + nLatches) << 1);
        uLit1 = uLit  - Ioa_ReadAigerDecode( &pCur );
        uLit0 = uLit1 - Ioa_ReadAigerDecode( &pCur );
//        assert( uLit1 > uLit0 );
        pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), uLit0 & 1 );
        pNode1 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit1 >> 1), uLit1 & 1 );
        assert( Vec_PtrSize(vNodes) == i + 1 + nInputs + nLatches );
        Vec_PtrPush( vNodes, Aig_And(pNew, pNode0, pNode1) );
    }
//    Bar_ProgressStop( pProgress );

    // remember the place where symbols begin
    pSymbols = pCur;

    // read the latch driver literals
    vDrivers = Vec_PtrAlloc( nLatches + nOutputs );
    if ( pContents[3] == ' ' ) // standard AIGER
    {
        pCur = pDrivers;
        for ( i = 0; i < nLatches; i++ )
        {
            uLit0 = atoi( pCur );  while ( *pCur++ != '\n' );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }
        // read the PO driver literals
        for ( i = 0; i < nOutputs; i++ )
        {
            uLit0 = atoi( pCur );  while ( *pCur++ != '\n' );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }

    }
    else
    {
        // read the latch driver literals
        for ( i = 0; i < nLatches; i++ )
        {
            uLit0 = Vec_IntEntry( vLits, i );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }
        // read the PO driver literals
        for ( i = 0; i < nOutputs; i++ )
        {
            uLit0 = Vec_IntEntry( vLits, i+nLatches );
            pNode0 = Aig_NotCond( (Aig_Obj_t *)Vec_PtrEntry(vNodes, uLit0 >> 1), (uLit0 & 1) );//^ (uLit0 < 2) );
            Vec_PtrPush( vDrivers, pNode0 );
        }
        Vec_IntFree( vLits );
    }

    // create the POs
    for ( i = 0; i < nOutputs; i++ )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vDrivers, nLatches + i) );
    for ( i = 0; i < nLatches; i++ )
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vDrivers, i) );
    Vec_PtrFree( vDrivers );

/*
    // read the names if present
    pCur = pSymbols;
    if ( *pCur != 'c' )
    {
        int Counter = 0;
        while ( pCur < pContents + nFileSize && *pCur != 'c' )
        {
            // get the terminal type
            pType = pCur;
            if ( *pCur == 'i' )
                vTerms = pNew->vPis;
            else if ( *pCur == 'l' )
                vTerms = pNew->vBoxes;
            else if ( *pCur == 'o' )
                vTerms = pNew->vPos;
            else
            {
                fprintf( stdout, "Wrong terminal type.\n" );
                return NULL;
            }
            // get the terminal number
            iTerm = atoi( ++pCur );  while ( *pCur++ != ' ' );
            // get the node
            if ( iTerm >= Vec_PtrSize(vTerms) )
            {
                fprintf( stdout, "The number of terminal is out of bound.\n" );
                return NULL;
            }
            pObj = Vec_PtrEntry( vTerms, iTerm );
            if ( *pType == 'l' )
                pObj = Aig_ObjFanout0(pObj);
            // assign the name
            pName = pCur;          while ( *pCur++ != '\n' );
            // assign this name 
            *(pCur-1) = 0;
            Aig_ObjAssignName( pObj, pName, NULL );
            if ( *pType == 'l' )
            {
                Aig_ObjAssignName( Aig_ObjFanin0(pObj), Aig_ObjName(pObj), "L" );
                Aig_ObjAssignName( Aig_ObjFanin0(Aig_ObjFanin0(pObj)), Aig_ObjName(pObj), "_in" );
            }
            // mark the node as named
            pObj->pCopy = (Aig_Obj_t *)Aig_ObjName(pObj);
        } 

        // assign the remaining names
        Aig_ManForEachCi( pNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Aig_ObjAssignName( pObj, Aig_ObjName(pObj), NULL );
            Counter++;
        }
        Aig_ManForEachLatchOutput( pNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Aig_ObjAssignName( pObj, Aig_ObjName(pObj), NULL );
            Aig_ObjAssignName( Aig_ObjFanin0(pObj), Aig_ObjName(pObj), "L" );
            Aig_ObjAssignName( Aig_ObjFanin0(Aig_ObjFanin0(pObj)), Aig_ObjName(pObj), "_in" );
            Counter++;
        }
        Aig_ManForEachCo( pNew, pObj, i )
        {
            if ( pObj->pCopy ) continue;
            Aig_ObjAssignName( pObj, Aig_ObjName(pObj), NULL );
            Counter++;
        }
        if ( Counter )
            printf( "Ioa_ReadAiger(): Added %d default names for nameless I/O/register objects.\n", Counter );
    }
    else
    {
//        printf( "Ioa_ReadAiger(): I/O/register names are not given. Generating short names.\n" );
        Aig_ManShortNames( pNew );
    }
*/
    pCur = pSymbols;
    if ( pCur + 1 < pContents + nFileSize && *pCur == 'c' )
    {
        pCur++;
        if ( *pCur == 'n' )
        {
            pCur++;
            // read model name
            ABC_FREE( pNew->pName );
            pNew->pName = Abc_UtilStrsav( pCur );
        }
    }

    // skipping the comments
    Vec_PtrFree( vNodes );

    // remove the extra nodes
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(pNew) );

    // update polarity of the additional outputs
    if ( nBad || nConstr || nJust || nFair )
        Aig_ManInvertConstraints( pNew );

    // check the result
    if ( fCheck && !Aig_ManCheck( pNew ) )
    {
        printf( "Ioa_ReadAiger: The network check has failed.\n" );
        Aig_ManStop( pNew );
        return NULL;
    }
    return pNew;
}